

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator=(ChFrame<double> *this,ChFrame<double> *other)

{
  ChFrame<double> *other_local;
  ChFrame<double> *this_local;
  
  if (other != this) {
    ChCoordsys<double>::operator=(&this->coord,&other->coord);
    ChMatrix33<double>::operator=(&this->Amatrix,&other->Amatrix);
  }
  return this;
}

Assistant:

ChFrame<Real>& operator=(const ChFrame<Real>& other) {
        if (&other == this)
            return *this;
        coord = other.coord;
        Amatrix = other.Amatrix;
        return *this;
    }